

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O2

CustomModel_CustomModelParamValue *
google::protobuf::internal::
MapArenaMessageCreator<CoreML::Specification::CustomModel_CustomModelParamValue,_false>::
CreateMessage(Arena *arena)

{
  CustomModel_CustomModelParamValue *this;
  
  if (arena == (Arena *)0x0) {
    this = (CustomModel_CustomModelParamValue *)operator_new(0x20);
    CoreML::Specification::CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue
              (this);
  }
  else {
    this = (CustomModel_CustomModelParamValue *)
           Arena::AllocateAligned
                     (arena,(type_info *)
                            &CoreML::Specification::CustomModel_CustomModelParamValue::typeinfo,0x20
                     );
    CoreML::Specification::CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue
              (this);
    Arena::AddListNode(arena,this,
                       arena_destruct_object<CoreML::Specification::CustomModel_CustomModelParamValue>
                      );
  }
  return this;
}

Assistant:

inline int
MapTypeHandler<WireFormatLite::TYPE_MESSAGE, Type>::GetCachedSize(
    const MapEntryAccessorType& value) {
  return WireFormatLite::LengthDelimitedSize(value.GetCachedSize());
}